

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_Plugin_RuntimeFeatures_Test::
TestBody(CommandLineInterfaceTest_Plugin_RuntimeFeatures_Test *this)

{
  bool bVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>_>
  *pVVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar3;
  Nonnull<std::string_*> dest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar4;
  char *in_R9;
  pointer *__ptr;
  string_view name;
  string_view src;
  string_view data;
  string_view filename;
  string_view contents;
  string binary_request;
  string plugin_path;
  string base64_output;
  CodeGeneratorRequest request;
  AssertHelper local_160;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  undefined1 local_148 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  AssertHelper local_128;
  char *local_120;
  size_t local_118;
  char local_110;
  undefined7 uStack_10f;
  string local_100;
  lts_20250127 *local_e0;
  AlphaNum *local_d8;
  long local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 local_b0 [32];
  undefined1 local_90 [16];
  undefined1 local_80 [56];
  RepeatedPtrFieldBase local_48;
  
  name._M_str = "foo.proto";
  name._M_len = 9;
  contents._M_str =
       "\n                      edition = \"2023\";\n                      package foo;\n                      message Foo {\n                        int32 b = 1 [features.field_presence = IMPLICIT];\n                      }"
  ;
  contents._M_len = 0xd1;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  local_e0 = (lts_20250127 *)local_d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/fake_plugin"
             ,"");
  local_90._0_8_ = (_func_int **)0x6b;
  local_90._8_8_ =
       "protocol_compiler --fake_plugin_out=$tmpdir --proto_path=$tmpdir foo.proto --plugin=prefix-gen-fake_plugin="
  ;
  local_c0._0_8_ = local_d8;
  local_c0._8_8_ = local_e0;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_100,(lts_20250127 *)local_90,(AlphaNum *)local_c0,local_d8);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  filename._M_str = &DAT_00000011;
  filename._M_len =
       (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.temp_directory_.
       _M_string_length;
  dest = (Nonnull<std::string_*>)&DAT_00000011;
  compiler::(anonymous_namespace)::CommandLineInterfaceTest::ReadFile_abi_cxx11_
            ((string *)local_c0,
             (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.temp_directory_
             ._M_dataplus._M_p,filename);
  local_118 = 0;
  local_110 = '\0';
  src._M_str = (char *)&local_120;
  src._M_len = local_c0._0_8_;
  local_120 = &local_110;
  local_148[0] = (internal)
                 absl::lts_20250127::Base64Unescape((lts_20250127 *)local_c0._8_8_,src,dest);
  local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_148[0]) {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_90,(internal *)local_148,
               (AssertionResult *)"absl::Base64Unescape(base64_output, &binary_request)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x6dd,(char *)local_90._0_8_);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((undefined1 *)local_90._0_8_ != local_80) {
      operator_delete((void *)local_90._0_8_,local_80._0_8_ + 1);
    }
    if (local_158._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_158._M_head_impl + 8))();
    }
    if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_140,local_140);
    }
    goto LAB_00a08b8b;
  }
  CodeGeneratorRequest::CodeGeneratorRequest((CodeGeneratorRequest *)local_90,(Arena *)0x0);
  data._M_str = local_120;
  data._M_len = local_118;
  bVar1 = MessageLite::ParseFromString((MessageLite *)local_90,data);
  local_158._M_head_impl._0_1_ = bVar1;
  local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    local_158._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x119551e;
    pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                       ((RepeatedPtrFieldBase *)(local_80 + 0x20),0);
    pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                       (&(pVVar2->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,0);
    protobuf::internal::RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
              (&(pVVar3->field_0)._impl_.field_.super_RepeatedPtrFieldBase,0);
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
              (local_148,(char *)&local_158,
               (FeatureSet *)"request.proto_file(0).message_type(0).field(0).options().features()");
    if (local_148[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_158);
      if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = (local_140->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_160,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x6e3,pcVar4);
      testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
      testing::internal::AssertHelper::~AssertHelper(&local_160);
      if (local_158._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_158._M_head_impl + 8))();
      }
    }
    if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_140,local_140);
    }
    local_158._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x119551e;
    pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                       (&local_48,0);
    pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                       (&(pVVar2->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,0);
    protobuf::internal::RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
              (&(pVVar3->field_0)._impl_.field_.super_RepeatedPtrFieldBase,0);
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
              (local_148,(char *)&local_158,
               (FeatureSet *)
               "request.source_file_descriptors(0) .message_type(0) .field(0) .options() .features()"
              );
    if (local_148[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_158);
      if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = (local_140->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_160,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x6e9,pcVar4);
      testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
      testing::internal::AssertHelper::~AssertHelper(&local_160);
      if (local_158._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_158._M_head_impl + 8))();
      }
    }
    if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_140;
      __ptr_00 = local_140;
LAB_00a08b79:
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,__ptr_00);
    }
  }
  else {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_150;
    testing::Message::Message((Message *)&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_148,(internal *)&local_158,
               (AssertionResult *)"request.ParseFromString(binary_request)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x6df,(char *)CONCAT71(local_148._1_7_,local_148[0]));
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_148._1_7_,local_148[0]) != &local_138) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_148._1_7_,local_148[0]),local_138._M_allocated_capacity + 1)
      ;
    }
    if (local_160.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_160.data_ + 8))();
    }
    __ptr_00 = local_150;
    if (local_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00a08b79;
  }
  CodeGeneratorRequest::~CodeGeneratorRequest((CodeGeneratorRequest *)local_90);
LAB_00a08b8b:
  if (local_120 != &local_110) {
    operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
  }
  if ((AlphaNum *)local_c0._0_8_ != (AlphaNum *)local_b0) {
    operator_delete((void *)local_c0._0_8_,local_b0._0_8_ + 1);
  }
  if (local_e0 != (lts_20250127 *)local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, Plugin_RuntimeFeatures) {
  CreateTempFile("foo.proto",
                 R"schema(
                      edition = "2023";
                      package foo;
                      message Foo {
                        int32 b = 1 [features.field_presence = IMPLICIT];
                      })schema");

#ifdef GOOGLE_PROTOBUF_FAKE_PLUGIN_PATH
  std::string plugin_path = GOOGLE_PROTOBUF_FAKE_PLUGIN_PATH;
#else
  std::string plugin_path = absl::StrCat(
      TestUtil::TestSourceDir(), "/google/protobuf/compiler/fake_plugin");
#endif

  // Invoke protoc with fake_plugin to get ahold of the CodeGeneratorRequest
  // sent by protoc.
  Run(absl::StrCat(
      "protocol_compiler --fake_plugin_out=$tmpdir --proto_path=$tmpdir "
      "foo.proto --plugin=prefix-gen-fake_plugin=",
      plugin_path));
  ExpectNoErrors();
  std::string base64_output = ReadFile("foo.proto.request");
  std::string binary_request;
  ASSERT_TRUE(absl::Base64Unescape(base64_output, &binary_request));
  CodeGeneratorRequest request;
  ASSERT_TRUE(request.ParseFromString(binary_request));

  EXPECT_THAT(
      request.proto_file(0).message_type(0).field(0).options().features(),
      EqualsProto(R"pb(field_presence: IMPLICIT)pb"));
  EXPECT_THAT(request.source_file_descriptors(0)
                  .message_type(0)
                  .field(0)
                  .options()
                  .features(),
              EqualsProto(R"pb(field_presence: IMPLICIT)pb"));
}